

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall LongReadsMapper::read_read_paths(LongReadsMapper *this,string *filename)

{
  string *in_RSI;
  ifstream ifs;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_stack_fffffffffffffde8;
  ifstream *in_stack_fffffffffffffdf0;
  
  std::ifstream::ifstream(&stack0xfffffffffffffde8,in_RSI,_S_bin);
  sdglib::read_flat_vectorvector<long>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::ifstream::~ifstream(&stack0xfffffffffffffde8);
  return;
}

Assistant:

void LongReadsMapper::read_read_paths(std::string filename) {
    std::ifstream ifs(filename, std::ios_base::binary);
    sdglib::read_flat_vectorvector(ifs,read_paths);
}